

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O2

FrameDisplay *
TTD::NSSnapValues::InflateScriptFunctionScopeInfo
          (ScriptFunctionScopeInfo *funcScopeInfo,InflateMap *inflator)

{
  int iVar1;
  ScopeInfoEntry *pSVar2;
  ushort uVar3;
  ScriptContext *pSVar4;
  Recycler *alloc;
  FrameDisplay *this;
  RecyclableObject *item;
  long lVar5;
  ulong uVar6;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  pSVar4 = InflateMap::LookupScriptContext(inflator,funcScopeInfo->ScriptContextLogId);
  data.typeinfo = (type_info *)((ulong)funcScopeInfo->ScopeCount << 3);
  local_58 = (undefined1  [8])&Js::FrameDisplay::typeinfo;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_4304930;
  data.filename._0_4_ = 0x300;
  alloc = Memory::Recycler::TrackAllocInfo(pSVar4->recycler,(TrackAllocData *)local_58);
  uVar6 = 0;
  lVar5 = 8;
  this = (FrameDisplay *)new<Memory::Recycler>(8,alloc,0x37ff80,0);
  uVar3 = funcScopeInfo->ScopeCount;
  this->tag = true;
  this->strictMode = false;
  this->length = uVar3;
  this->unused = 0;
  do {
    if (uVar3 <= uVar6) {
      return this;
    }
    pSVar2 = funcScopeInfo->ScopeArray;
    iVar1 = *(int *)((long)pSVar2 + lVar5 + -8);
    if (iVar1 == 2) {
LAB_0085a2f5:
      item = InflateMap::LookupObject(inflator,*(TTD_PTR_ID *)((long)&pSVar2->Tag + lVar5));
    }
    else {
      if (iVar1 != 1) {
        if (iVar1 != 0) {
          TTDAbort_unrecoverable_error("Unknown scope kind");
        }
        goto LAB_0085a2f5;
      }
      item = (RecyclableObject *)
             InflateMap::LookupSlotArray(inflator,*(TTD_PTR_ID *)((long)&pSVar2->Tag + lVar5));
    }
    Js::FrameDisplay::SetItem(this,(uint)uVar6,item);
    uVar6 = uVar6 + 1;
    uVar3 = funcScopeInfo->ScopeCount;
    lVar5 = lVar5 + 0x10;
  } while( true );
}

Assistant:

Js::FrameDisplay* InflateScriptFunctionScopeInfo(const ScriptFunctionScopeInfo* funcScopeInfo, InflateMap* inflator)
        {
            Js::ScriptContext* ctx = inflator->LookupScriptContext(funcScopeInfo->ScriptContextLogId);

            Js::FrameDisplay* environment = RecyclerNewPlus(ctx->GetRecycler(), funcScopeInfo->ScopeCount * sizeof(Js::Var), Js::FrameDisplay, funcScopeInfo->ScopeCount);

            for(uint16 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                const ScopeInfoEntry& scp = funcScopeInfo->ScopeArray[i];

                switch(scp.Tag)
                {
                case Js::ScopeType::ScopeType_ActivationObject:
                case Js::ScopeType::ScopeType_WithScope:
                {
                    Js::Var sval = inflator->LookupObject(scp.IDValue);
                    environment->SetItem(i, sval);
                    break;
                }
                case Js::ScopeType::ScopeType_SlotArray:
                {
                    Field(Js::Var)* saval = inflator->LookupSlotArray(scp.IDValue);
                    environment->SetItem(i, saval);
                    break;
                }
                default:
                    TTDAssert(false, "Unknown scope kind");
                    break;
                }
            }

            return environment;
        }